

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.hpp
# Opt level: O3

int __thiscall pg::TSPMSolver::todo_pop(TSPMSolver *this)

{
  int iVar1;
  ostream *this_00;
  long *plVar2;
  
  iVar1 = *(this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_start._M_cur;
  std::deque<int,_std::allocator<int>_>::pop_front(&this->todo);
  this->dirty[iVar1] = 0;
  if (1 < (this->super_Solver).trace) {
    this_00 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"pop() => ",9);
    plVar2 = (long *)std::ostream::operator<<(this_00,iVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
  }
  return iVar1;
}

Assistant:

int todo_pop() {
        int node = todo.front();
        todo.pop_front();
        dirty[node] = 0;
        if (trace >= 2) logger << "pop() => " << node << std::endl;
        return node;
    }